

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-lstm.cc
# Opt level: O2

void __thiscall
dynet::VanillaLSTMC::backward_dev_impl<dynet::Device_CPU>
          (VanillaLSTMC *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Tensor *this_00;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  DefaultDevice *local_138;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *local_130;
  ulong local_128;
  Tensor *local_120;
  ulong local_118;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_110;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_f8;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_e0;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_c8;
  ulong local_b0;
  undefined8 uStack_a8;
  ulong local_a0;
  ulong local_98;
  TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorSlicingOp<const_Eigen::DSizes<long,_2>,_const_Eigen::DSizes<long,_2>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>
  local_88;
  
  uVar1 = 1;
  if ((fx->d).nd != 0) {
    uVar1 = (ulong)(fx->d).d[0];
  }
  uVar3 = (ulong)(fx->d).bd;
  local_88.m_rhs_xpr.m_sizes.super_array<long,_2>._M_elems[0] = uVar1;
  local_88.m_rhs_xpr.m_sizes.super_array<long,_2>._M_elems[1] = uVar3;
  if (i == 1) {
    uVar2 = (ulong)(uint)((int)uVar1 * 3);
    local_120 = dEdf;
    local_118 = uVar2;
    Tensor::tbvec(&local_e0,dEdf);
    Tensor::tbvec(&local_f8,
                  (xs->
                  super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start[1]);
    local_88.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_f8.m_dimensions.super_array<long,_2>._M_elems[1];
    local_88.m_rhs_xpr.m_xpr.m_data = local_f8.m_data;
    local_88.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_f8.m_dimensions.super_array<long,_2>._M_elems[0];
    local_88.m_lhs_xpr.m_data = local_e0.m_data;
    local_88.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_e0.m_dimensions.super_array<long,_2>._M_elems[0];
    local_88.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_e0.m_dimensions.super_array<long,_2>._M_elems[1];
    local_88.m_rhs_xpr.m_indices.super_array<long,_2>._M_elems[1] = 0;
    local_128 = uVar3;
    local_88.m_rhs_xpr.m_indices.super_array<long,_2>._M_elems[0] = uVar2;
    Tensor::tbvec(&local_110,dEdxi);
    local_c8.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_110.m_dimensions.super_array<long,_2>._M_elems[1];
    local_c8.m_data = local_110.m_data;
    local_c8.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_110.m_dimensions.super_array<long,_2>._M_elems[0];
    local_b0 = 0;
    uStack_a8 = 0;
    local_138 = dev->edevice;
    local_130 = &local_c8;
    local_a0 = uVar1;
    local_98 = uVar3;
    Eigen::
    TensorDevice<Eigen::TensorSlicingOp<Eigen::DSizes<long,2>const,Eigen::DSizes<long,2>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
    ::operator+=((TensorDevice<Eigen::TensorSlicingOp<Eigen::DSizes<long,2>const,Eigen::DSizes<long,2>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
                  *)&local_138,&local_88);
    this_00 = local_120;
    Tensor::tbvec(&local_e0,local_120);
    Tensor::tbvec(&local_f8,
                  *(xs->
                   super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start);
    local_88.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_e0.m_dimensions.super_array<long,_2>._M_elems[1];
    local_88.m_lhs_xpr.m_data = local_e0.m_data;
    local_88.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_e0.m_dimensions.super_array<long,_2>._M_elems[0];
    local_88.m_rhs_xpr.m_xpr.m_data = local_f8.m_data;
    local_88.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_f8.m_dimensions.super_array<long,_2>._M_elems[0];
    local_88.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_f8.m_dimensions.super_array<long,_2>._M_elems[1];
    Tensor::tbvec(&local_110,dEdxi);
    uVar3 = local_128;
    local_c8.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_110.m_dimensions.super_array<long,_2>._M_elems[1];
    local_c8.m_data = local_110.m_data;
    local_c8.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_110.m_dimensions.super_array<long,_2>._M_elems[0];
    uStack_a8 = 0;
    local_98 = local_128;
    local_138 = dev->edevice;
    local_130 = &local_c8;
    local_b0 = uVar1;
    local_a0 = uVar1;
    Eigen::
    TensorDevice<Eigen::TensorSlicingOp<Eigen::DSizes<long,2>const,Eigen::DSizes<long,2>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
    ::operator+=((TensorDevice<Eigen::TensorSlicingOp<Eigen::DSizes<long,2>const,Eigen::DSizes<long,2>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
                  *)&local_138,
                 (TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
                  *)&local_88);
    Tensor::tbvec(&local_e0,this_00);
    Tensor::tbvec(&local_f8,
                  (xs->
                  super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start[1]);
    local_88.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_f8.m_dimensions.super_array<long,_2>._M_elems[1];
    local_88.m_rhs_xpr.m_xpr.m_data = local_f8.m_data;
    local_88.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_f8.m_dimensions.super_array<long,_2>._M_elems[0];
    local_88.m_lhs_xpr.m_data = local_e0.m_data;
    local_88.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_e0.m_dimensions.super_array<long,_2>._M_elems[0];
    local_88.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_e0.m_dimensions.super_array<long,_2>._M_elems[1];
    local_88.m_rhs_xpr.m_indices.super_array<long,_2>._M_elems[0] = 0;
    local_88.m_rhs_xpr.m_indices.super_array<long,_2>._M_elems[1] = 0;
    local_88.m_rhs_xpr.m_sizes.super_array<long,_2>._M_elems[1] = uVar3;
    local_88.m_rhs_xpr.m_sizes.super_array<long,_2>._M_elems[0] = uVar1;
    Tensor::tbvec(&local_110,dEdxi);
    local_c8.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_110.m_dimensions.super_array<long,_2>._M_elems[1];
    local_c8.m_data = local_110.m_data;
    local_c8.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_110.m_dimensions.super_array<long,_2>._M_elems[0];
    local_b0 = local_118;
    uStack_a8 = 0;
    local_98 = uVar3;
    local_138 = dev->edevice;
    local_130 = &local_c8;
    local_a0 = uVar1;
    Eigen::
    TensorDevice<Eigen::TensorSlicingOp<Eigen::DSizes<long,2>const,Eigen::DSizes<long,2>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
    ::operator+=((TensorDevice<Eigen::TensorSlicingOp<Eigen::DSizes<long,2>const,Eigen::DSizes<long,2>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>,Eigen::DefaultDevice>
                  *)&local_138,&local_88);
  }
  else if (i == 0) {
    Tensor::tbvec(&local_c8,dEdf);
    Tensor::tbvec(&local_e0,
                  (xs->
                  super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>)
                  ._M_impl.super__Vector_impl_data._M_start[1]);
    local_88.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_e0.m_dimensions.super_array<long,_2>._M_elems[1];
    local_88.m_rhs_xpr.m_xpr.m_data = local_e0.m_data;
    local_88.m_rhs_xpr.m_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_e0.m_dimensions.super_array<long,_2>._M_elems[0];
    local_88.m_lhs_xpr.m_data = local_c8.m_data;
    local_88.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[0] =
         local_c8.m_dimensions.super_array<long,_2>._M_elems[0];
    local_88.m_lhs_xpr.m_dimensions.super_array<long,_2>._M_elems[1] =
         local_c8.m_dimensions.super_array<long,_2>._M_elems[1];
    local_88.m_rhs_xpr.m_indices.super_array<long,_2>._M_elems[1] = 0;
    local_88.m_rhs_xpr.m_indices.super_array<long,_2>._M_elems[0] = uVar1;
    Tensor::tbvec(&local_f8,dEdxi);
    local_110.m_data = (StoragePointerType)dev->edevice;
    local_110.m_dimensions.super_array<long,_2>._M_elems[0] = (long)&local_f8;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator+=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                  *)&local_110,&local_88);
  }
  return;
}

Assistant:

void VanillaLSTMC::backward_dev_impl(const MyDevice & dev,
                               const vector<const Tensor*>& xs,
                               const Tensor& fx,
                               const Tensor& dEdf,
                               unsigned i,
                               Tensor& dEdxi) const {
    unsigned hidden_dim = fx.d[0];

    Eigen::DSizes<ptrdiff_t, 2> indices_i(0,0);
    Eigen::DSizes<ptrdiff_t, 2> indices_f(hidden_dim,0);
    Eigen::DSizes<ptrdiff_t, 2> indices_g(hidden_dim*3,0);
    Eigen::DSizes<ptrdiff_t, 2> sizes_1(hidden_dim, static_cast<ptrdiff_t>(fx.d.bd));

    if(i==0){ // dc_tm1 = dc_t . f_t
      dEdxi.tbvec().device(*dev.edevice) += dEdf.tbvec() * xs[1]->tbvec().slice(indices_f, sizes_1);
    } else if(i==1){
      // di_t = dc_t . g_t
      dEdxi.tbvec().slice(indices_i, sizes_1).device(*dev.edevice) += dEdf.tbvec() * xs[1]->tbvec().slice(indices_g, sizes_1);
      // df_t = dc_t . c_tm1
      dEdxi.tbvec().slice(indices_f, sizes_1).device(*dev.edevice) += dEdf.tbvec() * xs[0]->tbvec();
      // dg_t = dc_t . i_t
      dEdxi.tbvec().slice(indices_g, sizes_1).device(*dev.edevice) += dEdf.tbvec() * xs[1]->tbvec().slice(indices_i, sizes_1);
    }
  }